

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsetoutfilter(bifcxdef *ctx,int argc)

{
  long lVar1;
  uint uVar2;
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  
  uVar2 = (uint)*(byte *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10);
  if (uVar2 == 5) {
    out_set_filter(0xffff);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
  }
  else {
    if (uVar2 != 10) {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "setOutputFilter";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign((runcxdef *)CONCAT44(in_ESI,uVar2),in_stack_ffffffffffffffec);
    }
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\n') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_ESI,10),in_stack_ffffffffffffffec);
    }
    out_set_filter(*(objnum *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8));
  }
  return;
}

Assistant:

void bifsetoutfilter(bifcxdef *ctx, int argc)
{
    /* ensure we have the right number of arguments */
    bifcntargs(ctx, 1, argc);

    /* see what we have */
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NIL:
        /* remove the current filter */
        out_set_filter(MCMONINV);

        /* discard the argument */
        rundisc(ctx->bifcxrun);
        break;

    case DAT_FNADDR:
        /* set the filter to the given function */
        out_set_filter(runpopfn(ctx->bifcxrun));
        break;

    default:
        /* anything else is invalid */
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "setOutputFilter");
    }
}